

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
AdapterPromiseNode<kj::HttpClient::WebSocketResponse,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::WebSocketResponse>_>
::fulfill(AdapterPromiseNode<kj::HttpClient::WebSocketResponse,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::WebSocketResponse>_>
          *this,WebSocketResponse *value)

{
  ExceptionOr<kj::HttpClient::WebSocketResponse> local_1b0;
  
  if (this->waiting == true) {
    this->waiting = false;
    ExceptionOr<kj::HttpClient::WebSocketResponse>::ExceptionOr(&local_1b0,value);
    ExceptionOr<kj::HttpClient::WebSocketResponse>::operator=(&this->result,&local_1b0);
    ExceptionOr<kj::HttpClient::WebSocketResponse>::~ExceptionOr(&local_1b0);
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }